

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::WriteDependerConnections
          (cmGraphVizWriter *this,string *targetName,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedConnections,cmGeneratedFileStream *str)

{
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var1;
  long lVar2;
  bool bVar3;
  __type _Var4;
  TargetType targetType;
  const_iterator cVar5;
  const_iterator cVar6;
  iterator iVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  string *psVar10;
  string myNodeName;
  string connectionName;
  string libName;
  string local_90 [32];
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
          ::find(&(this->TargetPtrs)._M_t,targetName);
  p_Var1 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar5._M_node != p_Var1) {
    WriteNode(this,targetName,*(cmGeneratorTarget **)(cVar5._M_node + 2),insertedNodes,str);
    if (*(long *)(cVar5._M_node + 2) != 0) {
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->TargetNamesNodes)._M_t,targetName);
      std::__cxx11::string::string(local_90,(string *)(cVar6._M_node + 2));
      for (p_Var9 = (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != p_Var1; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9))
      {
        if (*(cmGeneratorTarget **)(p_Var9 + 2) != (cmGeneratorTarget *)0x0) {
          targetType = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var9 + 2));
          bVar3 = GenerateForTargetType(this,targetType);
          if (bVar3) {
            __k = p_Var9 + 1;
            lVar2 = **(long **)(p_Var9 + 2);
            for (psVar10 = *(string **)(lVar2 + 0x200); psVar10 != *(string **)(lVar2 + 0x208);
                psVar10 = psVar10 + 0x28) {
              std::__cxx11::string::string((string *)&local_50,psVar10);
              _Var4 = std::operator==(&local_50,targetName);
              if (_Var4) {
                cVar6 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::find(&(this->TargetNamesNodes)._M_t,(key_type *)__k);
                if ((_Rb_tree_header *)cVar6._M_node !=
                    &(this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header) {
                  std::__cxx11::string::string((string *)&local_70,(string *)(cVar6._M_node + 2));
                  std::__cxx11::string::append((char *)&local_70);
                  std::__cxx11::string::append((string *)&local_70);
                  iVar7 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find(&insertedConnections->_M_t,&local_70);
                  if ((_Rb_tree_header *)iVar7._M_node ==
                      &(insertedConnections->_M_t)._M_impl.super__Rb_tree_header) {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)insertedConnections,&local_70);
                    WriteNode(this,(string *)__k,*(cmGeneratorTarget **)(p_Var9 + 2),insertedNodes,
                              str);
                    poVar8 = std::operator<<((ostream *)str,"    \"");
                    poVar8 = std::operator<<(poVar8,(string *)(cVar6._M_node + 2));
                    poVar8 = std::operator<<(poVar8,"\" -> \"");
                    poVar8 = std::operator<<(poVar8,local_90);
                    std::operator<<(poVar8,"\"");
                    poVar8 = std::operator<<((ostream *)str," // ");
                    poVar8 = std::operator<<(poVar8,(string *)targetName);
                    poVar8 = std::operator<<(poVar8," -> ");
                    poVar8 = std::operator<<(poVar8,(string *)__k);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    WriteDependerConnections
                              (this,(string *)__k,insertedNodes,insertedConnections,str);
                  }
                  std::__cxx11::string::~string((string *)&local_70);
                }
                std::__cxx11::string::~string((string *)&local_50);
                break;
              }
              std::__cxx11::string::~string((string *)&local_50);
            }
          }
        }
      }
      std::__cxx11::string::~string(local_90);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteDependerConnections(const std::string& targetName,
                                    std::set<std::string>& insertedNodes,
                                    std::set<std::string>& insertedConnections,
                                    cmGeneratedFileStream& str) const
{
  std::map<std::string, const cmGeneratorTarget* >::const_iterator targetPtrIt
      = this->TargetPtrs.find(targetName);

  if (targetPtrIt == this->TargetPtrs.end())  // not found at all
    {
    return;
    }

  this->WriteNode(targetName, targetPtrIt->second, insertedNodes, str);

  if (targetPtrIt->second == NULL) // it's an external library
    {
    return;
    }


  std::string myNodeName = this->TargetNamesNodes.find(targetName)->second;

  // now search who links against me
  for(std::map<std::string, const cmGeneratorTarget*>::const_iterator
      dependerIt = this->TargetPtrs.begin();
      dependerIt != this->TargetPtrs.end();
      ++dependerIt)
    {
    if (dependerIt->second == NULL)
      {
      continue;
      }

    if (this->GenerateForTargetType(dependerIt->second->GetType()) == false)
      {
      continue;
      }

    // Now we have a target, check whether it links against targetName.
    // If so, draw a connection, and then continue with dependers on that one.
    const cmTarget::LinkLibraryVectorType* ll =
        &(dependerIt->second->Target->GetOriginalLinkLibraries());

    for (cmTarget::LinkLibraryVectorType::const_iterator llit = ll->begin();
         llit != ll->end();
         ++ llit )
      {
      std::string libName = llit->first;
      if (libName == targetName)
        {
        // So this target links against targetName.
        std::map<std::string, std::string>::const_iterator dependerNodeNameIt =
                                this->TargetNamesNodes.find(dependerIt->first);

        if(dependerNodeNameIt != this->TargetNamesNodes.end())
          {
          std::string connectionName = dependerNodeNameIt->second;
          connectionName += "-";
          connectionName += myNodeName;

          if (insertedConnections.find(connectionName) ==
                                                     insertedConnections.end())
            {
            insertedConnections.insert(connectionName);
            this->WriteNode(dependerIt->first, dependerIt->second,
                            insertedNodes, str);

            str << "    \"" << dependerNodeNameIt->second << "\" -> \""
                << myNodeName << "\"";
            str << " // " <<targetName<< " -> " <<dependerIt->first<<std::endl;
            this->WriteDependerConnections(dependerIt->first,
                                      insertedNodes, insertedConnections, str);
            }


          }
        break;
        }
      }
    }

}